

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

bool ProcessArray<aiVector3t<float>>
               (aiVector3t<float> **in,uint num,char *name,
               vector<bool,_std::allocator<bool>_> *dirtyMask,bool mayBeIdentical,bool mayBeZero)

{
  char *pcVar1;
  Logger *this;
  char *local_1c0 [4];
  ostream local_1a0 [376];
  
  pcVar1 = ValidateArrayContents<aiVector3t<float>>(*in,num,dirtyMask,mayBeIdentical,mayBeZero);
  if (pcVar1 != (char *)0x0) {
    this = Assimp::DefaultLogger::get();
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[38]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [38])"FindInvalidDataProcess fails on mesh ");
    std::operator<<(local_1a0,name);
    std::operator<<(local_1a0,": ");
    std::operator<<(local_1a0,pcVar1);
    std::__cxx11::stringbuf::str();
    Assimp::Logger::error(this,local_1c0[0]);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    if (*in != (aiVector3t<float> *)0x0) {
      operator_delete__(*in);
    }
    *in = (aiVector3t<float> *)0x0;
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

inline 
bool ProcessArray(T*& in, unsigned int num,const char* name,
        const std::vector<bool>& dirtyMask, bool mayBeIdentical = false, bool mayBeZero = true) {
    const char* err = ValidateArrayContents(in,num,dirtyMask,mayBeIdentical,mayBeZero);
    if (err)    {
        ASSIMP_LOG_ERROR_F( "FindInvalidDataProcess fails on mesh ", name, ": ", err);
        delete[] in;
        in = NULL;
        return true;
    }
    return false;
}